

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

void __thiscall cppcms::rpc::json_rpc_server::smd(json_rpc_server *this,value *v)

{
  ostringstream ss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  json::operator<<((ostream *)local_190,v);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->smd_,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void json_rpc_server::smd(json::value const &v)
	{
		std::ostringstream ss;
		ss<<v;
		smd_=ss.str();
	}